

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int build_pathname_utf16be(uchar *p,size_t max,size_t *len,file_info *file)

{
  int iVar1;
  file_info *file_local;
  size_t *len_local;
  size_t max_local;
  uchar *p_local;
  
  if ((file->parent != (file_info *)0x0) && (file->parent->utf16be_bytes != 0)) {
    iVar1 = build_pathname_utf16be(p,max,len,file->parent);
    if (iVar1 != 0) {
      return -1;
    }
    p[*len] = '\0';
    p[*len + 1] = '/';
    *len = *len + 2;
  }
  if (file->utf16be_bytes == 0) {
    if (max < *len + 2) {
      return -1;
    }
    p[*len] = '\0';
    p[*len + 1] = '.';
    *len = *len + 2;
  }
  else {
    if (max < *len + file->utf16be_bytes) {
      return -1;
    }
    memcpy(p + *len,file->utf16be_name,file->utf16be_bytes);
    *len = file->utf16be_bytes + *len;
  }
  return 0;
}

Assistant:

static int
build_pathname_utf16be(unsigned char *p, size_t max, size_t *len,
    struct file_info *file)
{
	if (file->parent != NULL && file->parent->utf16be_bytes > 0) {
		if (build_pathname_utf16be(p, max, len, file->parent) != 0)
			return (-1);
		p[*len] = 0;
		p[*len + 1] = '/';
		*len += 2;
	}
	if (file->utf16be_bytes == 0) {
		if (*len + 2 > max)
			return (-1);/* Path is too long! */
		p[*len] = 0;
		p[*len + 1] = '.';
		*len += 2;
	} else {
		if (*len + file->utf16be_bytes > max)
			return (-1);/* Path is too long! */
		memcpy(p + *len, file->utf16be_name, file->utf16be_bytes);
		*len += file->utf16be_bytes;
	}
	return (0);
}